

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1080.cpp
# Opt level: O2

void btf(int st)

{
  int iVar1;
  pointer piVar2;
  int in_EDI;
  ulong uVar3;
  int to;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_88;
  int local_84;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_84 = in_EDI;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_80,&local_84);
  colors[local_84] = 0;
  do {
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      return;
    }
    iVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    for (uVar3 = 0;
        piVar2 = edge[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)edge[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
        uVar3 = uVar3 + 1) {
      local_88 = piVar2[uVar3];
      if (colors[iVar1] == colors[local_88]) {
        std::operator<<((ostream *)&std::cout,"-1");
        exit(0);
      }
      if (colors[local_88] == -1) {
        colors[local_88] = (uint)(colors[iVar1] == 0);
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,&local_88);
      }
    }
  } while( true );
}

Assistant:

void btf(int st) {
    std::queue<int> q;
    q.push(st);
    colors[st] = 0;

    while (!q.empty()) {
        int v = q.front();
        q.pop();
        for (int i = 0; i < edge[v].size(); ++i) {
            int to = edge[v][i];
            if (colors[v] == colors[to]) {
                std::cout << "-1";
                exit(0);
            }
            if (colors[to] == -1) {
                colors[to] = colors[v] == 0 ? 1 : 0;
                q.push(to);
            }
        }
    }
}